

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult
testing::internal::EqFailure
          (char *expected_expression,char *actual_expression,string *expected_value,
          string *actual_value,bool ignoring_case)

{
  bool bVar1;
  AssertionResult *this;
  Message *this_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult *in_RDI;
  byte in_R9B;
  AssertionResult AVar2;
  Message msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  AssertionResult *this_01;
  AssertionResult *other;
  AssertionResult local_38 [3];
  
  local_38[0].message_.ptr_._7_1_ = in_R9B & 1;
  other = local_38;
  this_01 = in_RDI;
  Message::Message((Message *)in_RDI);
  this = (AssertionResult *)
         Message::operator<<((Message *)in_stack_ffffffffffffff60,
                             (char (*) [11])in_stack_ffffffffffffff58);
  Message::operator<<((Message *)in_stack_ffffffffffffff60,(char **)in_stack_ffffffffffffff58);
  bVar1 = std::operator!=(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if (bVar1) {
    Message::operator<<((Message *)in_stack_ffffffffffffff60,
                        (char (*) [12])in_stack_ffffffffffffff58);
    Message::operator<<((Message *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  Message::operator<<((Message *)in_stack_ffffffffffffff60,(char (*) [12])in_stack_ffffffffffffff58)
  ;
  Message::operator<<((Message *)in_stack_ffffffffffffff60,(char **)in_stack_ffffffffffffff58);
  if ((local_38[0].message_.ptr_._7_1_ & 1) != 0) {
    Message::operator<<((Message *)in_stack_ffffffffffffff60,
                        (char (*) [17])in_stack_ffffffffffffff58);
  }
  bVar1 = std::operator!=(in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
  if (bVar1) {
    this_00 = Message::operator<<((Message *)in_stack_ffffffffffffff60,
                                  (char (*) [12])in_stack_ffffffffffffff58);
    Message::operator<<(this_00,in_stack_ffffffffffffff58);
  }
  AssertionFailure();
  AssertionResult::operator<<(this_01,(Message *)in_RDI);
  AssertionResult::AssertionResult(this,other);
  AssertionResult::~AssertionResult((AssertionResult *)0x14952c);
  Message::~Message((Message *)0x149536);
  AVar2.message_.ptr_ = extraout_RDX.ptr_;
  AVar2._0_8_ = this_01;
  return AVar2;
}

Assistant:

AssertionResult EqFailure(const char* expected_expression,
                          const char* actual_expression,
                          const std::string& expected_value,
                          const std::string& actual_value,
                          bool ignoring_case) {
  Message msg;
  msg << "Value of: " << actual_expression;
  if (actual_value != actual_expression) {
    msg << "\n  Actual: " << actual_value;
  }

  msg << "\nExpected: " << expected_expression;
  if (ignoring_case) {
    msg << " (ignoring case)";
  }
  if (expected_value != expected_expression) {
    msg << "\nWhich is: " << expected_value;
  }

  return AssertionFailure() << msg;
}